

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O3

void __thiscall
chrono::ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>::
ChConstraintTuple_3vars
          (ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_> *this,
          ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_> *other)

{
  ChVariables *pCVar1;
  double dVar2;
  
  pCVar1 = other->variables_2;
  this->variables_1 = other->variables_1;
  this->variables_2 = pCVar1;
  this->variables_3 = other->variables_3;
  dVar2 = (other->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
          m_data.array[1];
  (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = (other->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
        array[0];
  (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [1] = dVar2;
  dVar2 = (other->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
          m_data.array[3];
  (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [2] = (other->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
        array[2];
  (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [3] = dVar2;
  dVar2 = (other->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
          m_data.array[5];
  (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [4] = (other->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
        array[4];
  (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [5] = dVar2;
  dVar2 = (other->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
          m_data.array[1];
  (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = (other->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
        array[0];
  (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [1] = dVar2;
  dVar2 = (other->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
          m_data.array[3];
  (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [2] = (other->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
        array[2];
  (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [3] = dVar2;
  dVar2 = (other->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
          m_data.array[5];
  (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [4] = (other->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
        array[4];
  (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [5] = dVar2;
  dVar2 = (other->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
          m_data.array[1];
  (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = (other->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
        array[0];
  (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [1] = dVar2;
  dVar2 = (other->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
          m_data.array[3];
  (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [2] = (other->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
        array[2];
  (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [3] = dVar2;
  dVar2 = (other->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
          m_data.array[5];
  (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [4] = (other->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
        array[4];
  (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [5] = dVar2;
  dVar2 = (other->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
          m_data.array[1];
  (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [0] = (other->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[0];
  (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [1] = dVar2;
  dVar2 = (other->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
          m_data.array[3];
  (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [2] = (other->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[2];
  (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [3] = dVar2;
  dVar2 = (other->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
          m_data.array[5];
  (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [4] = (other->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[4];
  (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [5] = dVar2;
  dVar2 = (other->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
          m_data.array[1];
  (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [0] = (other->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[0];
  (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [1] = dVar2;
  dVar2 = (other->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
          m_data.array[3];
  (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [2] = (other->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[2];
  (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [3] = dVar2;
  dVar2 = (other->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
          m_data.array[5];
  (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [4] = (other->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[4];
  (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [5] = dVar2;
  dVar2 = (other->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
          m_data.array[1];
  (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [0] = (other->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[0];
  (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [1] = dVar2;
  dVar2 = (other->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
          m_data.array[3];
  (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [2] = (other->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[2];
  (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [3] = dVar2;
  dVar2 = (other->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
          m_data.array[5];
  (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [4] = (other->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[4];
  (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [5] = dVar2;
  return;
}

Assistant:

ChConstraintTuple_3vars(const ChConstraintTuple_3vars& other) {
        variables_1 = other.variables_1;
        variables_2 = other.variables_2;
        variables_3 = other.variables_3;
        Cq_1 = other.Cq_1;
        Cq_2 = other.Cq_2;
        Cq_3 = other.Cq_3;
        Eq_1 = other.Eq_1;
        Eq_2 = other.Eq_2;
        Eq_3 = other.Eq_3;
    }